

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

bool __thiscall
mprpc::MpRpcServer::notify(MpRpcServer *this,string *conn_id,char *method,void *data,size_t size)

{
  __type _Var1;
  ssize_t sVar2;
  MpRpcServer *pMVar3;
  byte bVar4;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int __flags;
  MsgPackPacker pk;
  unique_lock<std::recursive_mutex> lock;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __flags = (int)size;
  pk.pk.data = &pk;
  bVar4 = 0;
  pk.sb.size = 0;
  pk.sb.data = (char *)0x0;
  pk.sb.alloc = 0;
  pk.pk.callback = msgpack_sbuffer_write;
  lock._M_device._0_1_ = 0x83;
  msgpack_sbuffer_write(&pk,(char *)&lock,1);
  MsgPackPacker::pack_map_item(&pk,"id",0);
  MsgPackPacker::pack_map_item(&pk,"method",method);
  MsgPackPacker::pack_string(&pk,"params",0);
  (*pk.pk.callback)(pk.pk.data,(char *)data,size);
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,(mutex_type *)(this + 8));
  pMVar3 = this + 0x40;
  do {
    while( true ) {
      pMVar3 = *(MpRpcServer **)pMVar3;
      if (pMVar3 == (MpRpcServer *)0x0) goto LAB_00147f41;
      if (conn_id->_M_string_length != 0) break;
      p_Var5 = &local_40;
      std::__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 (pMVar3 + 0x28));
      send((MpRpcServer *)p_Var5,(int)&local_40,pk.sb.data,pk.sb.size,__flags);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    _Var1 = std::operator==(conn_id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(pMVar3 + 8));
  } while (!_Var1);
  p_Var5 = &local_50;
  std::__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             (__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> *)(pMVar3 + 0x28));
  sVar2 = send((MpRpcServer *)p_Var5,(int)&local_50,pk.sb.data,pk.sb.size,__flags);
  bVar4 = (byte)sVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
LAB_00147f41:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  free(pk.sb.data);
  return (bool)(pMVar3 == (MpRpcServer *)0x0 | bVar4 & 1);
}

Assistant:

bool MpRpcServer::notify(const string& conn_id, const char* method, const void* data, size_t size)
    {
        MsgPackPacker pk;
        pk.pack_map(3);

        pk.pack_map_item("id", 0);
        pk.pack_map_item("method", method);
        pk.pack_string("params");
        msgpack_pack_str_body(&pk.pk, data, size);

        unique_lock<recursive_mutex> lock(m_conn_map_lock);

        for (auto it = m_conn_map.begin(); it != m_conn_map.end(); it++) {
            if (conn_id.empty()) {
                send(it->second, pk.sb.data, pk.sb.size);
            }
            else if (conn_id == it->first) {
                return send(it->second, pk.sb.data, pk.sb.size);
            }
        }
        return true;
    }